

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalBlocker.cc
# Opt level: O0

void __thiscall
SignalBlocker_instantiate_Test::~SignalBlocker_instantiate_Test
          (SignalBlocker_instantiate_Test *this)

{
  void *in_RDI;
  
  ~SignalBlocker_instantiate_Test((SignalBlocker_instantiate_Test *)0x154048);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(SignalBlocker, instantiate)
{
  using SignalType = sigs::Signal<void()>;
  SignalType s;
  sigs::SignalBlocker sb1(s);
  sigs::SignalBlocker<SignalType> sb2(s);
  sigs::SignalBlocker sb3(&s);
  sigs::SignalBlocker<SignalType> sb4(&s);
}